

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::LE_Fire_PDU::LE_Fire_PDU(LE_Fire_PDU *this)

{
  LE_Header::LE_Header(&this->super_LE_Header);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__LE_Fire_PDU_002144e8;
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_TargetID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_MunitionID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_EventID);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(&this->m_MunitionDesc);
  DATA_TYPE::RelativeWorldCoordinates::RelativeWorldCoordinates(&this->m_Loc);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_Vel);
  this->m_ui16Range = 0;
  (this->m_FireFlagUnion).m_ui8Flag = '\0';
  (this->super_LE_Header).super_Header.super_Header6.m_ui8PDUType = '1';
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = 0x23;
  return;
}

Assistant:

LE_Fire_PDU::LE_Fire_PDU() :
    m_ui16Range( 0 )
{
    m_FireFlagUnion.m_ui8Flag = 0;
    m_ui8PDUType = LEFire_PDU_Type;
    m_ui16PDULength = LE_FIRE_PDU_SIZE;
}